

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

void DestroyVocab(void)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (0 < vocab_size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      pvVar1 = *(void **)((long)&vocab->word + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      pvVar1 = *(void **)((long)&vocab->code + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      pvVar1 = *(void **)((long)&vocab->point + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x28;
    } while (lVar3 < vocab_size);
  }
  free(vocab[vocab_size].word);
  free(vocab);
  return;
}

Assistant:

void DestroyVocab() {
  int a;

  for (a = 0; a < vocab_size; a++) {
    if (vocab[a].word != NULL) {
      free(vocab[a].word);
    }
    if (vocab[a].code != NULL) {
      free(vocab[a].code);
    }
    if (vocab[a].point != NULL) {
      free(vocab[a].point);
    }
  }
  free(vocab[vocab_size].word);
  free(vocab);
}